

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::lockEntries
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this)

{
  Entry *pEVar1;
  bool bVar2;
  Entry *entries;
  PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this_local;
  
  do {
    do {
      pEVar1 = this->_entries;
    } while (pEVar1 == (Entry *)0x0);
    LOCK();
    bVar2 = pEVar1 == this->_entries;
    if (bVar2) {
      this->_entries = (Entry *)0x0;
    }
    UNLOCK();
  } while (!bVar2);
  return pEVar1;
}

Assistant:

Entry* lockEntries()
    {
        while (1) {
            Entry* entries = _entries;
            if (entries && AtomicCompareAndSwap(&_entries, entries, (Entry*)0)) {
                return entries;
            }
        }
    }